

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O2

void __thiscall QTipLabel::~QTipLabel(QTipLabel *this)

{
  ~QTipLabel(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

QTipLabel::~QTipLabel()
{
    instance = nullptr;
}